

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx.c
# Opt level: O1

int ps_start_stream(ps_decoder_t *ps)

{
  fe_t *pfVar1;
  noise_stats_t *noise_stats;
  int iVar2;
  
  iVar2 = -1;
  if (((ps->acmod != (acmod_t *)0x0) && (pfVar1 = ps->acmod->fe, pfVar1 != (fe_t *)0x0)) &&
     (noise_stats = pfVar1->noise_stats, noise_stats != (noise_stats_t *)0x0)) {
    fe_reset_noisestats(noise_stats);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int
ps_start_stream(ps_decoder_t *ps)
{
    if (ps->acmod == NULL)
        return -1;
    if (ps->acmod->fe == NULL)
        return -1;
    if (ps->acmod->fe->noise_stats == NULL)
        return -1;
    fe_reset_noisestats(ps->acmod->fe->noise_stats);
    return 0;
}